

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float afVar16 [16];
  float afVar17 [16];
  float afVar18 [16];
  float afVar19 [16];
  float afVar20 [16];
  float afVar21 [16];
  float afVar22 [16];
  float afVar23 [16];
  float afVar24 [16];
  float afVar25 [16];
  float afVar26 [16];
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  undefined1 (*pauVar33) [64];
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  float afVar63 [16];
  undefined1 auVar64 [64];
  undefined1 extraout_var [60];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float afVar69 [16];
  
  if ((this->super_GELU).fast_gelu == 0) {
    iVar29 = GELU::forward_inplace(&this->super_GELU,bottom_top_blob,opt);
    return iVar29;
  }
  iVar29 = bottom_top_blob->c;
  if (0 < (long)iVar29) {
    uVar31 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar32 = 0;
    auVar57 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
    auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
    auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f4c4229));
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0xc1100000));
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x41100000));
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0xa59f25c0));
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x2a61337e));
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xaebd37ff));
    auVar47 = vbroadcastss_avx512vl(ZEXT416(0x335c0041));
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3779434a));
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3a270ded));
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3ba059dc));
    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x35a0d3d8));
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
    auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3b14aa05));
    do {
      afVar26 = _ps512_cephes_tanh_p9;
      afVar25 = _ps512_cephes_tanh_p8;
      afVar24 = _ps512_cephes_tanh_p7;
      afVar23 = _ps512_cephes_tanh_p6;
      afVar22 = _ps512_cephes_tanh_p5;
      afVar21 = _ps512_cephes_tanh_p4;
      afVar20 = _ps512_cephes_tanh_p3;
      afVar19 = _ps512_cephes_tanh_p2;
      afVar18 = _ps512_cephes_tanh_p1;
      afVar17 = _ps512_cephes_tanh_p0;
      afVar16 = _ps512_tanh_hi;
      afVar69 = _ps512_tanh_lo;
      pauVar33 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar32 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar31 < 0x10) {
        uVar28 = 0;
        afVar63 = _ps512_cephes_tanh_p2;
      }
      else {
        iVar27 = 0xf;
        do {
          auVar64 = *pauVar33;
          auVar60 = vmulps_avx512f(auVar64,auVar64);
          auVar60 = vmulps_avx512f(auVar60,auVar57);
          auVar60 = vfmadd213ps_avx512f(auVar60,auVar64,auVar64);
          auVar60 = vmulps_avx512f(auVar60,auVar58);
          auVar60 = vmaxps_avx512f((undefined1  [64])afVar69,auVar60);
          auVar60 = vminps_avx512f((undefined1  [64])afVar16,auVar60);
          auVar61 = vmulps_avx512f(auVar60,auVar60);
          auVar62 = vfmadd213ps_avx512f((undefined1  [64])afVar17,auVar61,(undefined1  [64])afVar18)
          ;
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar19);
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar20);
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar21);
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar22);
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar23);
          auVar60 = vmulps_avx512f(auVar62,auVar60);
          auVar62 = vfmadd213ps_avx512f((undefined1  [64])afVar24,auVar61,(undefined1  [64])afVar25)
          ;
          auVar62 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar26);
          auVar61 = vfmadd213ps_avx512f(auVar62,auVar61,(undefined1  [64])afVar23);
          afVar63 = (float  [16])vdivps_avx512f(auVar60,auVar61);
          auVar64 = vmulps_avx512f(auVar64,auVar59);
          auVar64 = vfmadd213ps_avx512f(auVar64,(undefined1  [64])afVar63,auVar64);
          *pauVar33 = auVar64;
          pauVar33 = pauVar33 + 1;
          iVar27 = iVar27 + 0x10;
        } while (iVar27 < (int)uVar31);
        auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
        uVar28 = uVar31 & 0xfffffff0;
      }
      uVar30 = uVar28 | 7;
      auVar70._8_4_ = 0xc1100000;
      auVar70._0_8_ = 0xc1100000c1100000;
      auVar70._12_4_ = 0xc1100000;
      auVar71._8_4_ = 0x41100000;
      auVar71._0_8_ = 0x4110000041100000;
      auVar71._12_4_ = 0x41100000;
      auVar72._8_4_ = 0xa59f25c0;
      auVar72._0_8_ = 0xa59f25c0a59f25c0;
      auVar72._12_4_ = 0xa59f25c0;
      auVar73._8_4_ = 0x2a61337e;
      auVar73._0_8_ = 0x2a61337e2a61337e;
      auVar73._12_4_ = 0x2a61337e;
      auVar74._8_4_ = 0xaebd37ff;
      auVar74._0_8_ = 0xaebd37ffaebd37ff;
      auVar74._12_4_ = 0xaebd37ff;
      auVar75._8_4_ = 0x335c0041;
      auVar75._0_8_ = 0x335c0041335c0041;
      auVar75._12_4_ = 0x335c0041;
      auVar76._8_4_ = 0x3779434a;
      auVar76._0_8_ = 0x3779434a3779434a;
      auVar76._12_4_ = 0x3779434a;
      auVar77._8_4_ = 0x3a270ded;
      auVar77._0_8_ = 0x3a270ded3a270ded;
      auVar77._12_4_ = 0x3a270ded;
      auVar78._8_4_ = 0x3ba059dc;
      auVar78._0_8_ = 0x3ba059dc3ba059dc;
      auVar78._12_4_ = 0x3ba059dc;
      auVar79._8_4_ = 0x35a0d3d8;
      auVar79._0_8_ = 0x35a0d3d835a0d3d8;
      auVar79._12_4_ = 0x35a0d3d8;
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3b14aa05));
      while ((int)uVar30 < (int)uVar31) {
        auVar1 = *(undefined1 (*) [32])*pauVar33;
        fVar2 = auVar1._0_4_;
        auVar57._0_4_ = fVar2 * fVar2;
        fVar4 = auVar1._4_4_;
        auVar57._4_4_ = fVar4 * fVar4;
        fVar6 = auVar1._8_4_;
        auVar57._8_4_ = fVar6 * fVar6;
        fVar8 = auVar1._12_4_;
        auVar57._12_4_ = fVar8 * fVar8;
        fVar10 = auVar1._16_4_;
        auVar57._16_4_ = fVar10 * fVar10;
        fVar12 = auVar1._20_4_;
        auVar57._20_4_ = fVar12 * fVar12;
        fVar14 = auVar1._24_4_;
        auVar57._28_36_ = afVar63._28_36_;
        auVar57._24_4_ = fVar14 * fVar14;
        auVar54 = vmulps_avx512vl(auVar57._0_32_,auVar40);
        auVar37 = vfmadd213ps_fma(auVar54,auVar1,auVar1);
        auVar54 = vmulps_avx512vl(ZEXT1632(auVar37),auVar41);
        auVar54 = vmaxps_avx512vl(auVar54,auVar42);
        auVar55 = vminps_avx512vl(auVar54,auVar43);
        fVar3 = auVar55._0_4_;
        auVar58._0_4_ = fVar3 * fVar3;
        fVar5 = auVar55._4_4_;
        auVar58._4_4_ = fVar5 * fVar5;
        fVar7 = auVar55._8_4_;
        auVar58._8_4_ = fVar7 * fVar7;
        fVar9 = auVar55._12_4_;
        auVar58._12_4_ = fVar9 * fVar9;
        fVar11 = auVar55._16_4_;
        auVar58._16_4_ = fVar11 * fVar11;
        fVar13 = auVar55._20_4_;
        auVar58._20_4_ = fVar13 * fVar13;
        fVar15 = auVar55._24_4_;
        auVar58._28_36_ = afVar69._28_36_;
        auVar58._24_4_ = fVar15 * fVar15;
        auVar68 = auVar58._0_32_;
        afVar69 = (float  [16])ZEXT3264(auVar68);
        auVar54 = vfmadd213ps_avx512vl(auVar44,auVar68,auVar45);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar68,auVar46);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar68,auVar47);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar68,auVar48);
        auVar54 = vfmadd213ps_avx512vl(auVar54,auVar68,auVar49);
        auVar56 = vfmadd213ps_avx512vl(auVar54,auVar68,auVar50);
        auVar54._4_4_ = auVar56._4_4_ * fVar5;
        auVar54._0_4_ = auVar56._0_4_ * fVar3;
        auVar54._8_4_ = auVar56._8_4_ * fVar7;
        auVar54._12_4_ = auVar56._12_4_ * fVar9;
        auVar54._16_4_ = auVar56._16_4_ * fVar11;
        auVar54._20_4_ = auVar56._20_4_ * fVar13;
        auVar54._24_4_ = auVar56._24_4_ * fVar15;
        auVar54._28_4_ = auVar55._28_4_;
        auVar55 = vfmadd213ps_avx512vl(auVar51,auVar68,auVar52);
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar68,auVar53);
        auVar55 = vfmadd213ps_avx512vl(auVar55,auVar68,auVar50);
        auVar54 = vdivps_avx(auVar54,auVar55);
        afVar63 = (float  [16])ZEXT3264(auVar54);
        auVar55._4_4_ = fVar4 * 0.5;
        auVar55._0_4_ = fVar2 * 0.5;
        auVar55._8_4_ = fVar6 * 0.5;
        auVar55._12_4_ = fVar8 * 0.5;
        auVar55._16_4_ = fVar10 * 0.5;
        auVar55._20_4_ = fVar12 * 0.5;
        auVar55._24_4_ = fVar14 * 0.5;
        auVar55._28_4_ = auVar1._28_4_;
        auVar37 = vfmadd213ps_fma(auVar55,auVar54,auVar55);
        *(undefined1 (*) [32])*pauVar33 = ZEXT1632(auVar37);
        pauVar33 = (undefined1 (*) [64])(*pauVar33 + 0x20);
        uVar30 = uVar28 + 0xf;
        uVar28 = uVar28 + 8;
      }
      uVar30 = uVar28 | 3;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      while ((int)uVar30 < (int)uVar31) {
        auVar39 = *(undefined1 (*) [16])*pauVar33;
        auVar38._0_4_ = auVar39._0_4_ * auVar39._0_4_ * 0.044715;
        auVar38._4_4_ = auVar39._4_4_ * auVar39._4_4_ * 0.044715;
        auVar38._8_4_ = auVar39._8_4_ * auVar39._8_4_ * 0.044715;
        auVar38._12_4_ = auVar39._12_4_ * auVar39._12_4_ * 0.044715;
        auVar38 = vfmadd213ps_fma(auVar38,auVar39,auVar39);
        auVar65._0_4_ = auVar38._0_4_ * 0.7978845;
        auVar65._4_4_ = auVar38._4_4_ * 0.7978845;
        auVar65._8_4_ = auVar38._8_4_ * 0.7978845;
        auVar65._12_4_ = auVar38._12_4_ * 0.7978845;
        auVar38 = vmaxps_avx(auVar65,auVar70);
        auVar38 = vminps_avx(auVar38,auVar71);
        fVar2 = auVar38._0_4_;
        auVar67._0_4_ = fVar2 * fVar2;
        fVar3 = auVar38._4_4_;
        auVar67._4_4_ = fVar3 * fVar3;
        fVar4 = auVar38._8_4_;
        auVar67._8_4_ = fVar4 * fVar4;
        fVar5 = auVar38._12_4_;
        auVar67._12_4_ = fVar5 * fVar5;
        auVar38 = vfmadd213ps_fma(auVar72,auVar67,auVar73);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar74);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar75);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar76);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar77);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar78);
        auVar66._0_4_ = auVar38._0_4_ * fVar2;
        auVar66._4_4_ = auVar38._4_4_ * fVar3;
        auVar66._8_4_ = auVar38._8_4_ * fVar4;
        auVar66._12_4_ = auVar38._12_4_ * fVar5;
        auVar38 = vfmadd213ps_avx512vl(auVar79,auVar67,auVar35);
        auVar38 = vfmadd213ps_avx512vl(auVar38,auVar67,auVar36);
        auVar38 = vfmadd213ps_fma(auVar38,auVar67,auVar78);
        auVar38 = vdivps_avx(auVar66,auVar38);
        auVar39 = vmulps_avx512vl(auVar39,auVar37);
        auVar39 = vfmadd213ps_fma(auVar39,auVar38,auVar39);
        *(undefined1 (*) [16])*pauVar33 = auVar39;
        pauVar33 = (undefined1 (*) [64])(*pauVar33 + 0x10);
        uVar30 = uVar28 + 7;
        uVar28 = uVar28 + 4;
      }
      if (uVar31 - uVar28 != 0 && (int)uVar28 <= (int)uVar31) {
        lVar34 = 0;
        do {
          fVar2 = *(float *)(*pauVar33 + lVar34 * 4);
          auVar35 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 * 0.044715)),ZEXT416((uint)fVar2),
                                    ZEXT416((uint)fVar2));
          auVar59._0_4_ = tanhf(auVar35._0_4_ * 0.7978845);
          auVar59._4_60_ = extraout_var;
          auVar35 = vfmadd213ss_fma(auVar59._0_16_,ZEXT416((uint)(fVar2 * 0.5)),
                                    ZEXT416((uint)(fVar2 * 0.5)));
          *(int *)(*pauVar33 + lVar34 * 4) = auVar35._0_4_;
          lVar34 = lVar34 + 1;
        } while (uVar31 - uVar28 != (int)lVar34);
      }
      lVar32 = lVar32 + 1;
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f4c4229));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0xc1100000));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x41100000));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0xa59f25c0));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x2a61337e));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xaebd37ff));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x335c0041));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3779434a));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3a270ded));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3ba059dc));
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x35a0d3d8));
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3b14aa05));
    } while (lVar32 != iVar29);
  }
  return 0;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}